

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  mapped_type *pmVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  initializer_list<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  typeToStringMap;
  allocator_type local_1b2;
  less<std::type_index> local_1b1;
  _Rb_tree<std::type_index,_std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pointer_____offset_0x10___ *local_148;
  undefined4 *local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined2 local_12c;
  pointer_____offset_0x10___ *local_120;
  undefined4 *local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined2 local_104;
  pointer_____offset_0x10___ *local_f8;
  undefined4 *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined1 local_dc;
  undefined1 local_db;
  pointer_____offset_0x10___ *local_d0;
  undefined7 *local_c8;
  undefined8 local_c0;
  undefined7 local_b8;
  undefined4 uStack_b1;
  undefined1 local_ad;
  pointer_____offset_0x10___ *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined1 local_84;
  pointer_____offset_0x10___ *local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined1 local_5c;
  pointer_____offset_0x10___ *local_58;
  undefined8 *local_50 [2];
  undefined8 local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  local_170.second._M_dataplus._M_p = (pointer)&local_170.second.field_2;
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  local_170.second.field_2._M_allocated_capacity._0_4_ = 0x65736142;
  local_170.second._M_string_length = 4;
  local_170.second.field_2._M_local_buf[4] = '\0';
  local_148 = &A<Base>::typeinfo;
  local_140 = &local_130;
  local_12c = 0x65;
  local_130 = 0x73614241;
  local_138 = 5;
  local_120 = &B<Base>::typeinfo;
  local_118 = &local_108;
  local_104 = 0x65;
  local_108 = 0x73614242;
  local_110 = 5;
  local_f8 = &C<Base>::typeinfo;
  local_f0 = &local_e0;
  local_e0 = 0x73614243;
  local_dc = 0x65;
  local_e8 = 5;
  local_db = 0;
  local_d0 = &BaseVirtual::typeinfo;
  local_c8 = &local_b8;
  local_b8 = 0x72695665736142;
  uStack_b1 = 0x6c617574;
  local_c0 = 0xb;
  local_ad = 0;
  local_a8 = &A<BaseVirtual>::typeinfo;
  local_a0 = &local_90;
  local_90 = 0x7269566573614241;
  local_88 = 0x6c617574;
  local_98 = 0xc;
  local_84 = 0;
  local_80 = &B<BaseVirtual>::typeinfo;
  local_78 = &local_68;
  local_68 = 0x7269566573614242;
  local_60 = 0x6c617574;
  local_70 = 0xc;
  local_5c = 0;
  local_58 = &C<BaseVirtual>::typeinfo;
  local_38 = 0x6c617574;
  local_40 = 0x7269566573614243;
  local_50[1] = (undefined8 *)0xc;
  local_34 = 0;
  __l._M_len = 8;
  __l._M_array = &local_170;
  local_50[0] = &local_40;
  std::
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_1b0,__l,&local_1b1,&local_1b2);
  lVar4 = 0;
  do {
    if ((void *)((long)&local_40 + lVar4) != *(void **)((long)local_50 + lVar4)) {
      operator_delete(*(void **)((long)local_50 + lVar4));
    }
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x140);
  local_178 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_178->_M_use_count = 1;
  local_178->_M_weak_count = 1;
  local_178->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109bb8;
  local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_180->_M_use_count = 1;
  local_180->_M_weak_count = 1;
  local_180->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c30;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c80;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109cd0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR_get_type_index_00109b70;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109d20;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR_get_type_index_00109b88;
  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_02->_M_use_count = 1;
  this_02->_M_weak_count = 1;
  this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109d70;
  this_02[1]._vptr__Sp_counted_base = (_func_int **)&PTR_get_type_index_00109ba0;
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&A<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&B<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&C<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar1 = (**this_00[1]._vptr__Sp_counted_base)();
  local_170.first._M_target = (type_info *)CONCAT44(extraout_var,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar1 = (**this_01[1]._vptr__Sp_counted_base)();
  local_170.first._M_target = (type_info *)CONCAT44(extraout_var_00,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar1 = (**this_02[1]._vptr__Sp_counted_base)();
  local_170.first._M_target = (type_info *)CONCAT44(extraout_var_01,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&A<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&B<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_170.first._M_target = (type_info *)&C<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1b0,&local_170.first);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  std::
  _Rb_tree<std::type_index,_std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1b0);
  return 0;
}

Assistant:

int main( int argc,
          char **argv )
{
  std::map<std::type_index, std::string> typeToStringMap = { { std::type_index( typeid(Base) ), "Base" }, { std::type_index( typeid(A<Base> ) ), "ABase" }, { std::type_index( typeid(B<Base> ) ), "BBase" }, { std::type_index( typeid(C<Base> ) ), "CBase" }, { std::type_index( typeid(BaseVirtual) ),
      "BaseVirtual" }, { std::type_index( typeid(A<BaseVirtual> ) ), "ABaseVirtual" }, { std::type_index( typeid(B<BaseVirtual> ) ), "BBaseVirtual" }, { std::type_index( typeid(C<BaseVirtual> ) ), "CBaseVirtual" } };

  A<Base> a;
  B<Base> b;
  C<Base> c;

  A<BaseVirtual> av;
  B<BaseVirtual> bv;
  C<BaseVirtual> cv;

  auto asp = std::make_shared<A<Base>>( );
  auto bsp = std::make_shared<B<Base>>( );
  auto csp = std::make_shared<C<Base>>( );

  auto avsp = std::make_shared<A<BaseVirtual>>( );
  auto bvsp = std::make_shared<B<BaseVirtual>>( );
  auto cvsp = std::make_shared<C<BaseVirtual>>( );

  A<Base>* ap = new A<Base>;
  B<Base>* bp = new B<Base>;
  C<Base>* cp = new C<Base>;

  A<BaseVirtual>* avp = new A<BaseVirtual>;
  B<BaseVirtual>* bvp = new B<BaseVirtual>;
  C<BaseVirtual>* cvp = new C<BaseVirtual>;

  std::cout << typeToStringMap[a.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[b.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[c.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[av.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bv.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cv.get_type_index( )] << std::endl;

  std::cout << typeToStringMap[asp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[csp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvsp->get_type_index( )] << std::endl;

  std::cout << typeToStringMap[ap->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvp->get_type_index( )] << std::endl;
}